

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<VkSpecParser::TypedName>::emplace<VkSpecParser::TypedName>
          (QGenericArrayOps<VkSpecParser::TypedName> *this,qsizetype i,TypedName *args)

{
  qsizetype *pqVar1;
  TypedName **ppTVar2;
  Data *pDVar3;
  long lVar4;
  TypedName *pTVar5;
  Data *pDVar6;
  char16_t *pcVar7;
  qsizetype qVar8;
  Data *pDVar9;
  char16_t *pcVar10;
  qsizetype qVar11;
  Data *pDVar12;
  char16_t *pcVar13;
  qsizetype qVar14;
  long in_FS_OFFSET;
  bool bVar15;
  Inserter local_c8;
  TypedName local_78;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QArrayDataPointer<VkSpecParser::TypedName>).d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
LAB_00109502:
    local_78.name.d.d = (args->name).d.d;
    local_78.name.d.ptr = (args->name).d.ptr;
    (args->name).d.d = (Data *)0x0;
    (args->name).d.ptr = (char16_t *)0x0;
    local_78.name.d.size = (args->name).d.size;
    (args->name).d.size = 0;
    local_78.type.d.d = (args->type).d.d;
    local_78.type.d.ptr = (args->type).d.ptr;
    (args->type).d.d = (Data *)0x0;
    (args->type).d.ptr = (char16_t *)0x0;
    local_78.type.d.size = (args->type).d.size;
    (args->type).d.size = 0;
    local_78.typeSuffix.d.d = (args->typeSuffix).d.d;
    local_78.typeSuffix.d.ptr = (args->typeSuffix).d.ptr;
    (args->typeSuffix).d.d = (Data *)0x0;
    (args->typeSuffix).d.ptr = (char16_t *)0x0;
    local_78.typeSuffix.d.size = (args->typeSuffix).d.size;
    (args->typeSuffix).d.size = 0;
    bVar15 = (this->super_QArrayDataPointer<VkSpecParser::TypedName>).size != 0;
    QArrayDataPointer<VkSpecParser::TypedName>::detachAndGrow
              (&this->super_QArrayDataPointer<VkSpecParser::TypedName>,(uint)(i == 0 && bVar15),1,
               (TypedName **)0x0,(QArrayDataPointer<VkSpecParser::TypedName> *)0x0);
    qVar14 = local_78.typeSuffix.d.size;
    pcVar13 = local_78.typeSuffix.d.ptr;
    pDVar12 = local_78.typeSuffix.d.d;
    qVar11 = local_78.type.d.size;
    pcVar10 = local_78.type.d.ptr;
    pDVar9 = local_78.type.d.d;
    qVar8 = local_78.name.d.size;
    pcVar7 = local_78.name.d.ptr;
    pDVar6 = local_78.name.d.d;
    if (i == 0 && bVar15) {
      pTVar5 = (this->super_QArrayDataPointer<VkSpecParser::TypedName>).ptr;
      local_78.name.d.d = (Data *)0x0;
      pTVar5[-1].name.d.d = pDVar6;
      local_78.name.d.ptr = (char16_t *)0x0;
      pTVar5[-1].name.d.ptr = pcVar7;
      local_78.name.d.size = 0;
      pTVar5[-1].name.d.size = qVar8;
      local_78.type.d.d = (Data *)0x0;
      pTVar5[-1].type.d.d = pDVar9;
      local_78.type.d.ptr = (char16_t *)0x0;
      pTVar5[-1].type.d.ptr = pcVar10;
      local_78.type.d.size = 0;
      pTVar5[-1].type.d.size = qVar11;
      local_78.typeSuffix.d.d = (Data *)0x0;
      pTVar5[-1].typeSuffix.d.d = pDVar12;
      local_78.typeSuffix.d.ptr = (char16_t *)0x0;
      pTVar5[-1].typeSuffix.d.ptr = pcVar13;
      local_78.typeSuffix.d.size = 0;
      pTVar5[-1].typeSuffix.d.size = qVar14;
      (this->super_QArrayDataPointer<VkSpecParser::TypedName>).ptr = pTVar5 + -1;
      pqVar1 = &(this->super_QArrayDataPointer<VkSpecParser::TypedName>).size;
      *pqVar1 = *pqVar1 + 1;
    }
    else {
      local_c8.sourceCopyConstruct = 0;
      local_c8.nSource = 0;
      local_c8.move = 0;
      local_c8.sourceCopyAssign = 0;
      local_c8.end = (TypedName *)0x0;
      local_c8.last = (TypedName *)0x0;
      local_c8.where = (TypedName *)0x0;
      local_c8.begin = (this->super_QArrayDataPointer<VkSpecParser::TypedName>).ptr;
      local_c8.size = (this->super_QArrayDataPointer<VkSpecParser::TypedName>).size;
      local_c8.data = &this->super_QArrayDataPointer<VkSpecParser::TypedName>;
      Inserter::insertOne(&local_c8,i,&local_78);
      (local_c8.data)->ptr = local_c8.begin;
      (local_c8.data)->size = local_c8.size;
    }
    if (&(local_78.typeSuffix.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.typeSuffix.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.typeSuffix.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + -1;
      UNLOCK();
      if (((local_78.typeSuffix.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
          == 0) {
        QArrayData::deallocate(&(local_78.typeSuffix.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_78.type.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.type.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.type.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.type.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_78.type.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_78.name.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_78.name.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  else {
    lVar4 = (this->super_QArrayDataPointer<VkSpecParser::TypedName>).size;
    if ((lVar4 == i && pDVar3 != (Data *)0x0) &&
       ((pDVar3->super_QArrayData).alloc - lVar4 !=
        ((long)((long)(this->super_QArrayDataPointer<VkSpecParser::TypedName>).ptr -
               ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
        -0x71c71c71c71c71c7)) {
      pTVar5 = (this->super_QArrayDataPointer<VkSpecParser::TypedName>).ptr;
      pDVar6 = (args->name).d.d;
      (args->name).d.d = (Data *)0x0;
      pTVar5[lVar4].name.d.d = pDVar6;
      pcVar7 = (args->name).d.ptr;
      (args->name).d.ptr = (char16_t *)0x0;
      pTVar5[lVar4].name.d.ptr = pcVar7;
      qVar8 = (args->name).d.size;
      (args->name).d.size = 0;
      pTVar5[lVar4].name.d.size = qVar8;
      pDVar6 = (args->type).d.d;
      (args->type).d.d = (Data *)0x0;
      pTVar5[lVar4].type.d.d = pDVar6;
      pcVar7 = (args->type).d.ptr;
      (args->type).d.ptr = (char16_t *)0x0;
      pTVar5[lVar4].type.d.ptr = pcVar7;
      qVar8 = (args->type).d.size;
      (args->type).d.size = 0;
      pTVar5[lVar4].type.d.size = qVar8;
      pDVar6 = (args->typeSuffix).d.d;
      (args->typeSuffix).d.d = (Data *)0x0;
      pTVar5[lVar4].typeSuffix.d.d = pDVar6;
      pcVar7 = (args->typeSuffix).d.ptr;
      (args->typeSuffix).d.ptr = (char16_t *)0x0;
      pTVar5[lVar4].typeSuffix.d.ptr = pcVar7;
      qVar8 = (args->typeSuffix).d.size;
      (args->typeSuffix).d.size = 0;
      pTVar5[lVar4].typeSuffix.d.size = qVar8;
    }
    else {
      if (((i != 0) || (pDVar3 == (Data *)0x0)) ||
         ((TypedName *)((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)
          == (this->super_QArrayDataPointer<VkSpecParser::TypedName>).ptr)) goto LAB_00109502;
      pTVar5 = (this->super_QArrayDataPointer<VkSpecParser::TypedName>).ptr;
      pDVar6 = (args->name).d.d;
      (args->name).d.d = (Data *)0x0;
      pTVar5[-1].name.d.d = pDVar6;
      pcVar7 = (args->name).d.ptr;
      (args->name).d.ptr = (char16_t *)0x0;
      pTVar5[-1].name.d.ptr = pcVar7;
      qVar8 = (args->name).d.size;
      (args->name).d.size = 0;
      pTVar5[-1].name.d.size = qVar8;
      pDVar6 = (args->type).d.d;
      (args->type).d.d = (Data *)0x0;
      pTVar5[-1].type.d.d = pDVar6;
      pcVar7 = (args->type).d.ptr;
      (args->type).d.ptr = (char16_t *)0x0;
      pTVar5[-1].type.d.ptr = pcVar7;
      qVar8 = (args->type).d.size;
      (args->type).d.size = 0;
      pTVar5[-1].type.d.size = qVar8;
      pDVar6 = (args->typeSuffix).d.d;
      (args->typeSuffix).d.d = (Data *)0x0;
      pTVar5[-1].typeSuffix.d.d = pDVar6;
      pcVar7 = (args->typeSuffix).d.ptr;
      (args->typeSuffix).d.ptr = (char16_t *)0x0;
      pTVar5[-1].typeSuffix.d.ptr = pcVar7;
      qVar8 = (args->typeSuffix).d.size;
      (args->typeSuffix).d.size = 0;
      pTVar5[-1].typeSuffix.d.size = qVar8;
      ppTVar2 = &(this->super_QArrayDataPointer<VkSpecParser::TypedName>).ptr;
      *ppTVar2 = *ppTVar2 + -1;
    }
    pqVar1 = &(this->super_QArrayDataPointer<VkSpecParser::TypedName>).size;
    *pqVar1 = *pqVar1 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this).insertOne(i, std::move(tmp));
        }
    }